

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool console_getline(string *_cmd,CommandList *_commands,Sandbox *_sandbox)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ostream *poVar12;
  size_t sVar13;
  _Base_ptr p_Var14;
  mapped_type *pmVar15;
  size_t i;
  ulong uVar16;
  char *pcVar17;
  string *psVar18;
  allocator local_b9;
  MEVENT m;
  string local_90;
  string local_70;
  string local_50;
  
  if (uniforms == (Uniforms *)0x0) {
    uniforms = &_sandbox->uniforms;
  }
  std::__cxx11::string::string((string *)&local_70,(string *)&cmd_abi_cxx11_);
  suggest(&local_50,&local_70,&cmd_suggested_abi_cxx11_,_commands);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  console_refresh();
  iVar9 = wgetch(_stdscr);
  iVar10 = 0x434c78;
  std::__cxx11::string::assign((char *)&cmd_suggested_abi_cxx11_);
  if ((iVar9 == 0x154) || (iVar9 == 9)) {
    cmd_tab_counter = cmd_tab_counter + 1;
  }
  else {
    cmd_tab_counter = 0;
  }
  switch(iVar9) {
  case 0x148:
    pcVar17 = "KEY_DL";
    break;
  case 0x149:
    pcVar17 = "KEY_IL";
    break;
  case 0x14a:
switchD_00200696_caseD_107:
    if (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length) {
      std::__cxx11::string::erase
                (&cmd_abi_cxx11_,
                 cmd_abi_cxx11_._M_dataplus._M_p +
                 (cmd_abi_cxx11_._M_string_length - cmd_cursor_offset) + -1);
    }
    goto LAB_00200ae1;
  case 0x14b:
    pcVar17 = "KEY_IC";
    break;
  case 0x14c:
  case 0x151:
  case 0x152:
  case 0x155:
  case 0x156:
switchD_002006fd_caseD_14c:
    if (iVar9 - 0x151U < 2) {
      out_offset_line = out_offset_line + -1;
      goto LAB_002009b3;
    }
    switch(iVar9) {
    case 0x155:
      pcVar17 = "KEY_CTAB";
      break;
    default:
      std::__cxx11::string::insert
                (&cmd_abi_cxx11_,
                 cmd_abi_cxx11_._M_dataplus._M_p +
                 (cmd_abi_cxx11_._M_string_length - cmd_cursor_offset),1,(int)(char)iVar9);
      goto LAB_00200ae1;
    case 0x158:
      pcVar17 = "KEY_SRESET";
      break;
    case 0x159:
      pcVar17 = "KEY_RESET";
      break;
    case 0x15a:
      pcVar17 = "KEY_PRINT";
      break;
    case 0x15b:
      pcVar17 = "KEY_LL";
      break;
    case 0x15c:
      pcVar17 = "KEY_A1";
      break;
    case 0x15d:
      pcVar17 = "KEY_A3";
      break;
    case 0x15e:
      pcVar17 = "KEY_B2";
      break;
    case 0x15f:
      pcVar17 = "KEY_C1";
      break;
    case 0x160:
      pcVar17 = "KEY_C3";
      break;
    case 0x161:
      pcVar17 = "KEY_BTAB";
      break;
    case 0x162:
      pcVar17 = "KEY_BEG";
      break;
    case 0x163:
      pcVar17 = "KEY_CANCEL";
      break;
    case 0x164:
      pcVar17 = "KEY_CLOSE";
      break;
    case 0x165:
      pcVar17 = "KEY_COMMAND";
      break;
    case 0x166:
      pcVar17 = "KEY_COPY";
      break;
    case 0x167:
      pcVar17 = "KEY_CREATE";
      break;
    case 0x168:
      pcVar17 = "KEY_END";
      break;
    case 0x169:
      pcVar17 = "KEY_EXIT";
      break;
    case 0x16a:
      pcVar17 = "KEY_FIND";
      break;
    case 0x16b:
      pcVar17 = "KEY_HELP";
      break;
    case 0x16c:
      pcVar17 = "KEY_MARK";
      break;
    case 0x16d:
      pcVar17 = "KEY_MESSAGE";
      break;
    case 0x16e:
      pcVar17 = "KEY_MOVE";
      break;
    case 0x16f:
      pcVar17 = "KEY_NEXT";
      break;
    case 0x170:
      pcVar17 = "KEY_OPEN";
      break;
    case 0x173:
      pcVar17 = "KEY_REDO";
      break;
    case 0x175:
      pcVar17 = "KEY_REFRESH";
      break;
    case 0x178:
      pcVar17 = "KEY_RESUME";
      break;
    case 0x189:
      pcVar17 = "KEY_SLEFT";
      break;
    case 0x192:
      pcVar17 = "KEY_SRIGHT";
      break;
    case 0x199:
      if (((mouse_capture_enabled == true) && (iVar10 = getmouse(&m), iVar10 == 0)) &&
         (stt_visible == true)) {
        bVar7 = wenclose(stt_win,m.y,m.x);
        if (((byte)((m.bstate & 2) >> 1) & bVar7) == 1) {
          cVar8 = wmouse_trafo(stt_win,&m.y,&m.x,0);
          if (cVar8 != '\0') {
            mouse_x = m.x;
            mouse_y = m.y;
            iVar10 = m.y - uniforms_starts_at;
            if (uniforms_starts_at <= m.y) goto LAB_002010f9;
          }
        }
        else if ((m.bstate & 1) != 0) {
          iVar10 = -1;
          if (((-1 < mouse_at) &&
              (cVar8 = wmouse_trafo(stt_win,&m.y,&m.x,0), iVar5 = mouse_y, iVar4 = mouse_x,
              cVar8 != '\0')) &&
             (pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                        ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_), pmVar15->size < 5))
          {
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                      ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
            (pmVar15->value)._M_elems[mouse_at_index] =
                 (float)(m.x - iVar4) * 0.01 + (float)(m.y - iVar5) * 0.1 +
                 (pmVar15->value)._M_elems[mouse_at_index];
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                      ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
            pmVar15->change = true;
            (*(uniforms->super_Scene)._vptr_Scene[0x3b])();
          }
LAB_002010f9:
          mouse_at = iVar10;
        }
      }
      goto LAB_00200ae1;
    }
    break;
  case 0x14d:
    pcVar17 = "KEY_CLEAR";
    break;
  case 0x14e:
    pcVar17 = "KEY_EOS";
    break;
  case 0x14f:
  case 0x157:
switchD_002006fd_caseD_14f:
    std::__cxx11::string::string((string *)&m,"",&local_b9);
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    std::__cxx11::string::~string((string *)&m);
    std::__cxx11::string::string((string *)&m,"",&local_b9);
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    std::__cxx11::string::~string((string *)&m);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd_history_abi_cxx11_,&cmd_abi_cxx11_);
    cmd_cursor_offset = 0;
    cmd_history_offset = 0;
    std::__cxx11::string::_M_assign((string *)_cmd);
    std::__cxx11::string::assign((char *)&cmd_abi_cxx11_);
    goto LAB_00200ae6;
  case 0x150:
  case 0x153:
    out_offset_line = out_offset_line + 1;
LAB_002009b3:
    refresh_out_win();
    goto LAB_00200ae1;
  case 0x154:
switchD_002006fd_caseD_154:
    std::__cxx11::string::string((string *)&m,"",&local_b9);
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    std::__cxx11::string::~string((string *)&m);
    std::__cxx11::string::string((string *)&m,"",&local_b9);
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    std::__cxx11::string::~string((string *)&m);
    if (cmd_abi_cxx11_._M_string_length != 0) {
      lVar11 = std::__cxx11::string::find('X',0x2c);
      if (lVar11 == -1) {
        poVar12 = std::operator<<((ostream *)&std::cout,"Suggestions:\n");
        std::endl<char,std::char_traits<char>>(poVar12);
        std::__cxx11::string::string((string *)&local_90,(string *)&cmd_abi_cxx11_);
        suggest((string *)&m,&local_90,&cmd_suggested_abi_cxx11_,_commands);
        std::operator<<((ostream *)&std::cout,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_90);
        if ((cmd_tab_counter < 2) || (cmd_suggested_abi_cxx11_._M_string_length == 0)) {
          psVar18 = &cmd_suggested_abi_cxx11_;
          goto LAB_00200cd4;
        }
        std::__cxx11::string::_M_assign((string *)&cmd_abi_cxx11_);
        cmd_tab_counter = 0;
      }
      else {
        poVar12 = std::operator<<((ostream *)&std::cout,"Use:");
        std::endl<char,std::char_traits<char>>(poVar12);
        lVar11 = 0x40;
        for (uVar16 = 0;
            pCVar1 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar16 < (ulong)(((long)(_commands->
                                    super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pCVar1) / 0x88);
            uVar16 = uVar16 + 1) {
          bVar6 = vera::beginsWith(&cmd_abi_cxx11_,(string *)((long)pCVar1 + lVar11 + -0x40));
          if (bVar6) {
            poVar12 = std::operator<<((ostream *)&std::cout,"      ");
            lVar2 = *(long *)poVar12;
            lVar3 = *(long *)(lVar2 + -0x18);
            *(uint *)(poVar12 + lVar3 + 0x18) =
                 *(uint *)(poVar12 + lVar3 + 0x18) & 0xffffff4f | 0x20;
            *(undefined8 *)(poVar12 + *(long *)(lVar2 + -0x18) + 0x10) = 0x10;
            poVar12 = std::operator<<(poVar12,(string *)
                                              ((long)(_commands->
                                                                                                          
                                                  super__Vector_base<Command,_std::allocator<Command>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                              lVar11 + -0x20));
            poVar12 = std::operator<<(poVar12,"   ");
            poVar12 = std::operator<<(poVar12,(string *)
                                              ((long)&(((_commands->
                                                                                                                
                                                  super__Vector_base<Command,_std::allocator<Command>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  trigger)._M_dataplus._M_p + lVar11));
            std::endl<char,std::char_traits<char>>(poVar12);
          }
          lVar11 = lVar11 + 0x88;
        }
        for (p_Var14 = (_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var14 !=
            &(_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
          bVar6 = vera::beginsWith(&cmd_abi_cxx11_,(string *)(p_Var14 + 1));
          if (bVar6) {
            std::operator<<((ostream *)&std::cout,(string *)(p_Var14 + 1));
            while (*(long *)(p_Var14 + 5) != 0) {
              std::operator<<((ostream *)&std::cout,",<value>");
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        poVar12 = std::operator<<((ostream *)&std::cout,"\nNotes:");
        std::endl<char,std::char_traits<char>>(poVar12);
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  "      - <values> between <...> brakets need to be change for and actual value"
                                 );
        std::endl<char,std::char_traits<char>>(poVar12);
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  "      - when words are separated by | you must choose one of the options, like: A|B|C"
                                 );
        std::endl<char,std::char_traits<char>>(poVar12);
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  "      * everything betwee [...] is optative");
        std::endl<char,std::char_traits<char>>(poVar12);
      }
    }
    goto LAB_00200ae1;
  default:
    switch(iVar9) {
    case 0x101:
switchD_00200696_caseD_101:
      std::__cxx11::string::append((char *)&cmd_abi_cxx11_);
      break;
    case 0x102:
      if (cmd_history_offset != 0 &&
          cmd_history_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          cmd_history_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        cmd_cursor_offset = 0;
        cmd_history_offset = cmd_history_offset - 1;
        if (cmd_history_offset != 0) goto LAB_00200a8d;
        std::__cxx11::string::assign((char *)&cmd_abi_cxx11_);
      }
      break;
    case 0x103:
      uVar16 = (long)cmd_history_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)cmd_history_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (cmd_history_offset < uVar16 - 1) {
        cmd_history_offset = cmd_history_offset + 1;
      }
      cmd_cursor_offset = 0;
      if (cmd_history_offset < uVar16) {
LAB_00200a8d:
        cmd_cursor_offset = 0;
        psVar18 = &cmd_abi_cxx11_;
LAB_00200cd4:
        std::__cxx11::string::_M_assign((string *)psVar18);
      }
      break;
    case 0x104:
      cmd_cursor_offset = cmd_cursor_offset + (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length);
      break;
    case 0x105:
      bVar6 = cmd_cursor_offset != 0;
      sVar13 = cmd_cursor_offset - 1;
      cmd_cursor_offset = 0;
      if (bVar6) {
        cmd_cursor_offset = sVar13;
      }
      break;
    case 0x106:
      pcVar17 = "KEY_HOME";
      goto LAB_00200ad4;
    case 0x107:
      goto switchD_00200696_caseD_107;
    case 0x108:
      pcVar17 = "KEY_F0";
      goto LAB_00200ad4;
    default:
      if (iVar9 == 9) goto switchD_002006fd_caseD_154;
      if (iVar9 != 0x19a) {
        if (iVar9 == 0x20) goto switchD_00200696_caseD_101;
        if (iVar9 != 0x7f) {
          if (iVar9 == 10) goto switchD_002006fd_caseD_14f;
          goto switchD_002006fd_caseD_14c;
        }
        goto switchD_00200696_caseD_107;
      }
      console_sigwinch_handler(iVar10);
    }
    goto LAB_00200ae1;
  }
LAB_00200ad4:
  poVar12 = std::operator<<((ostream *)&std::cout,pcVar17);
  std::endl<char,std::char_traits<char>>(poVar12);
LAB_00200ae1:
  refresh_cursor();
LAB_00200ae6:
  return iVar9 == 0x14f || (iVar9 == 0x157 || iVar9 == 10);
}

Assistant:

bool console_getline(std::string& _cmd, CommandList& _commands, Sandbox& _sandbox) {
    #if defined(SUPPORT_NCURSES)

    if (uniforms == nullptr)
        uniforms = &_sandbox.uniforms;

    suggest(cmd, cmd_suggested, _commands);
    console_refresh();

    int ch = getch();
    cmd_suggested = "";
    if (ch == KEY_STAB || ch == '\t') 
        cmd_tab_counter++;
    else
        cmd_tab_counter = 0;

    if ( ch == '\n' || ch == KEY_ENTER || ch == KEY_EOL) {
        buffer_cout.str("");
        buffer_cerr.str("");
        cmd_history.push_back( cmd );
        cmd_cursor_offset = 0;
        cmd_history_offset = 0;

        _cmd = cmd;
        cmd = "";

        return true;
    }
    else if ( ch == KEY_BACKSPACE || ch == KEY_DC || ch == 127 ) {
        if (cmd.size() > cmd_cursor_offset)
            cmd.erase(cmd.end()-cmd_cursor_offset-1, cmd.end()-cmd_cursor_offset);
    }
    else if ( ch == KEY_STAB || ch == '\t') {
        buffer_cout.str("");
        buffer_cerr.str("");
        if (cmd.size() > 0) {
            if (cmd.find(',') == std::string::npos) {
                std::cout << "Suggestions:\n" << std::endl;
                // cmd_suggested = "";
                std::cout << suggest(cmd, cmd_suggested, _commands);

                if (cmd_tab_counter > 1 && cmd_suggested.size() > 0) {
                    cmd = cmd_suggested;
                    cmd_tab_counter = 0;
                }
                else
                    cmd_suggested = cmd_suggested;
            }
            else {
                std::cout << "Use:" << std::endl;

                for (size_t i = 0; i < _commands.size(); i++)
                    if ( vera::beginsWith(cmd, _commands[i].trigger) )
                        std::cout << "      " << std::left << std::setw(16) << _commands[i].formula << "   " << _commands[i].description << std::endl;

                for (UniformDataMap::iterator it = _sandbox.uniforms.data.begin(); it != _sandbox.uniforms.data.end(); ++it) {
                    if ( vera::beginsWith(cmd, it->first) ) {
                        std::cout << it->first;

                        for (size_t i = 0; it->second.size; i++)
                            std::cout << ",<value>";
                        
                        std::cout << std::endl;
                    }
                }

                std::cout << "\nNotes:" << std::endl;
                std::cout << "      - <values> between <...> brakets need to be change for and actual value" << std::endl;
                std::cout << "      - when words are separated by | you must choose one of the options, like: A|B|C" << std::endl;
                std::cout << "      * everything betwee [...] is optative" << std::endl;
            }
        }
    }
    else if ( ch == KEY_BREAK || ch == ' ') {
        cmd += "_";
    }
    else if ( ch == KEY_LEFT)
        cmd_cursor_offset += cmd_cursor_offset < cmd.size() ? 1 : 0;
    else if ( ch == KEY_RIGHT)
        cmd_cursor_offset = cmd_cursor_offset == 0 ? 0 : cmd_cursor_offset-1;
    else if ( ch == KEY_DOWN ) {
        if (cmd_history.size() > 0 && cmd_history_offset > 0) {
            cmd_history_offset--;
            cmd_cursor_offset = 0;

            if (cmd_history_offset == 0)
                cmd = "";
            else
                cmd = cmd_history[ cmd_history.size() - cmd_history_offset ];
        }
    }
    else if ( ch == KEY_UP ) {
        if (cmd_history_offset < cmd_history.size() - 1)
            cmd_history_offset++;
        cmd_cursor_offset = 0;
        if (cmd_history_offset < cmd_history.size() )
            cmd = cmd_history[ cmd_history.size() - 1 - cmd_history_offset ];
    }
    else if ( ch == KEY_RESIZE)
        console_sigwinch_handler(0);
    else if ( ch == KEY_HOME)
        std::cout << "KEY_HOME" << std::endl;
    else if ( ch == KEY_F0)
        std::cout << "KEY_F0" << std::endl;
    else if ( ch == KEY_DL )
        std::cout << "KEY_DL" << std::endl;
    else if ( ch == KEY_IL )
        std::cout << "KEY_IL" << std::endl;
    else if ( ch == KEY_DC )
        std::cout << "KEY_DC" << std::endl;
    else if ( ch == KEY_IC )
        std::cout << "KEY_IC" << std::endl;
    else if ( ch == KEY_CLEAR)
        std::cout << "KEY_CLEAR" << std::endl;
    else if ( ch == KEY_EOS)
        std::cout << "KEY_EOS" << std::endl;
    else if ( ch == KEY_EOL)
        std::cout << "KEY_EOL" << std::endl;
    else if ( ch == KEY_SF || ch == 339 ) {
        out_offset_line++;
        refresh_out_win();
    }
    else if ( ch == KEY_SR || ch == 338 ) {
        out_offset_line--;
        refresh_out_win();
    }
    else if ( ch == KEY_NPAGE)
        std::cout << "KEY_NPAGE" << std::endl;
    else if ( ch == KEY_PPAGE)
        std::cout << "KEY_PPAGE" << std::endl;
    else if ( ch == KEY_CTAB)
        std::cout << "KEY_CTAB" << std::endl;
    else if ( ch == KEY_BTAB)
        std::cout << "KEY_BTAB" << std::endl;
    else if ( ch == KEY_SRESET)
        std::cout << "KEY_SRESET" << std::endl;
    else if ( ch == KEY_RESET)
        std::cout << "KEY_RESET" << std::endl;
    else if ( ch == KEY_PRINT)
        std::cout << "KEY_PRINT" << std::endl;
    else if ( ch == KEY_LL)
        std::cout << "KEY_LL" << std::endl;
    else if ( ch == KEY_A1)
        std::cout << "KEY_A1" << std::endl;
    else if ( ch == KEY_A3)
        std::cout << "KEY_A3" << std::endl;
    else if ( ch == KEY_B2)
        std::cout << "KEY_B2" << std::endl;
    else if ( ch == KEY_C1)
        std::cout << "KEY_C1" << std::endl;
    else if ( ch == KEY_C3)
        std::cout << "KEY_C3" << std::endl;
    else if ( ch == KEY_BEG)
        std::cout << "KEY_BEG" << std::endl;
    else if ( ch == KEY_CANCEL)
        std::cout << "KEY_CANCEL" << std::endl;
    else if ( ch == KEY_CLOSE)
        std::cout << "KEY_CLOSE" << std::endl;
    else if ( ch == KEY_COMMAND)
        std::cout << "KEY_COMMAND" << std::endl;
    else if ( ch == KEY_COPY)
        std::cout << "KEY_COPY" << std::endl;
    else if ( ch == KEY_CREATE)
        std::cout << "KEY_CREATE" << std::endl;
    else if ( ch == KEY_END)
        std::cout << "KEY_END" << std::endl;
    else if ( ch == KEY_EXIT)
        std::cout << "KEY_EXIT" << std::endl;
    else if ( ch == KEY_FIND)
        std::cout << "KEY_FIND" << std::endl;
    else if ( ch == KEY_HELP)
        std::cout << "KEY_HELP" << std::endl;
    else if ( ch == KEY_MARK)
        std::cout << "KEY_MARK" << std::endl;
    else if ( ch == KEY_MESSAGE)
        std::cout << "KEY_MESSAGE" << std::endl;
    else if ( ch == KEY_MOUSE) {
        if (mouse_capture_enabled) {
            MEVENT m;
            if (getmouse(&m) == OK) {
                if (stt_visible) {
                    if ( wenclose(stt_win, m.y, m.x) && (m.bstate & BUTTON1_PRESSED) ) {
                        if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                            mouse_x = m.x;
                            mouse_y = m.y;
                            if (mouse_y >= uniforms_starts_at)
                                mouse_at = mouse_y - uniforms_starts_at;
                        }
                    }
                    else if ( m.bstate & BUTTON1_RELEASED) {
                        if (mouse_at >= 0) {
                            if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                                float delta = (m.x - mouse_x) * 0.01 + (m.y - mouse_y) * 0.1;
                                if (uniforms->data[mouse_at_key].size < 5) {
                                    uniforms->data[mouse_at_key].value[mouse_at_index] += delta;
                                    uniforms->data[mouse_at_key].change = true;
                                    uniforms->flagChange();
                                }
                            }
                        }
                        mouse_at = -1;
                    }
                }
            }
        }
    }
    else if ( ch == KEY_MOVE)
        std::cout << "KEY_MOVE" << std::endl;
    else if ( ch == KEY_NEXT)
        std::cout << "KEY_NEXT" << std::endl;
    else if ( ch == KEY_OPEN)
        std::cout << "KEY_OPEN" << std::endl;
    else if ( ch == KEY_REDO)
        std::cout << "KEY_REDO" << std::endl;
    else if ( ch == KEY_REFRESH)
        std::cout << "KEY_REFRESH" << std::endl;
    else if ( ch == KEY_RESUME)
        std::cout << "KEY_RESUME" << std::endl;
    else if ( ch == KEY_SLEFT)
        std::cout << "KEY_SLEFT" << std::endl;
    else if ( ch == KEY_SRIGHT)
        std::cout << "KEY_SRIGHT" << std::endl;

    
    // else if ( ch == KEY_END || ch == KEY_EXIT || ch == 27 || ch == EOF) {
    //     keepRunnig = false;
    //     keepRunnig.store(false);
    //     break;
    // }
    else
        cmd.insert(cmd.end() - cmd_cursor_offset, 1, (char)ch );  
      
    refresh_cursor();
    // suggest(cmd, cmd_suggested, _commands);
    #endif

    return false;
}